

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmBinaryReader.cpp
# Opt level: O0

void __thiscall Wasm::WasmBinaryReader::BrTableNode(WasmBinaryReader *this)

{
  uint uVar1;
  uint64 uVar2;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar3;
  uint *puVar4;
  uint local_54;
  uint32 i;
  TrackAllocData local_40;
  uint32 local_14;
  WasmBinaryReader *pWStack_10;
  uint32 len;
  WasmBinaryReader *this_local;
  
  local_14 = 0;
  pWStack_10 = this;
  uVar1 = LEB128<unsigned_int,32u>(this,&local_14);
  (this->super_WasmReaderBase).m_currentNode.field_1.brTable.numTargets = uVar1;
  uVar1 = (this->super_WasmReaderBase).m_currentNode.field_1.brTable.numTargets;
  uVar2 = Limits::GetMaxBrTableElems();
  if (uVar2 < uVar1) {
    ThrowDecodingError(this,L"br_table too big");
  }
  (this->m_funcState).count = (this->m_funcState).count + local_14;
  pAVar3 = &this->m_alloc->super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_40,(type_info *)&unsigned_int::typeinfo,0,
             (ulong)(this->super_WasmReaderBase).m_currentNode.field_1.brTable.numTargets,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmBinaryReader.cpp"
             ,0x262);
  pAVar3 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo(pAVar3,&local_40);
  puVar4 = Memory::AllocateArray<Memory::ArenaAllocator,unsigned_int,false>
                     ((Memory *)pAVar3,(ArenaAllocator *)Memory::ArenaAllocator::Alloc,0,
                      (ulong)(this->super_WasmReaderBase).m_currentNode.field_1.brTable.numTargets);
  (this->super_WasmReaderBase).m_currentNode.field_1.brTable.targetTable = puVar4;
  for (local_54 = 0;
      local_54 < (this->super_WasmReaderBase).m_currentNode.field_1.brTable.numTargets;
      local_54 = local_54 + 1) {
    uVar1 = LEB128<unsigned_int,32u>(this,&local_14);
    (this->super_WasmReaderBase).m_currentNode.field_1.brTable.targetTable[local_54] = uVar1;
    (this->m_funcState).count = local_14 + (this->m_funcState).count;
  }
  uVar1 = LEB128<unsigned_int,32u>(this,&local_14);
  (this->super_WasmReaderBase).m_currentNode.field_1.brTable.defaultTarget = uVar1;
  (this->m_funcState).count = local_14 + (this->m_funcState).count;
  return;
}

Assistant:

void WasmBinaryReader::BrTableNode()
{
    uint32 len = 0;
    m_currentNode.brTable.numTargets = LEB128(len);
    if (m_currentNode.brTable.numTargets > Limits::GetMaxBrTableElems())
    {
        ThrowDecodingError(_u("br_table too big"));
    }
    m_funcState.count += len;
    m_currentNode.brTable.targetTable = AnewArray(m_alloc, uint32, m_currentNode.brTable.numTargets);

    for (uint32 i = 0; i < m_currentNode.brTable.numTargets; i++)
    {
        m_currentNode.brTable.targetTable[i] = LEB128(len);
        m_funcState.count += len;
    }
    m_currentNode.brTable.defaultTarget = LEB128(len);
    m_funcState.count += len;
}